

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

TIntermNode * __thiscall
glslang::TParseContext::addSwitch
          (TParseContext *this,TSourceLoc *loc,TIntermTyped *expression,
          TIntermAggregate *lastStatements)

{
  TIntermediate *this_00;
  TVector<TIntermNode_*> *pTVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  ulong uVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  reference ppTVar5;
  size_type sVar6;
  TIntermBranch *node;
  TIntermAggregate *this_01;
  undefined4 extraout_var_02;
  TParseContext *this_02;
  TIntermTyped *pTVar7;
  TIntermSwitch *switchNode;
  TIntermAggregate *body;
  TString *local_38;
  TIntermSequence *switchSequence;
  TIntermAggregate *lastStatements_local;
  TIntermTyped *expression_local;
  TSourceLoc *loc_local;
  TParseContext *this_local;
  
  switchSequence = (TIntermSequence *)lastStatements;
  lastStatements_local = (TIntermAggregate *)expression;
  expression_local = (TIntermTyped *)loc;
  loc_local = (TSourceLoc *)this;
  TParseVersions::profileRequires((TParseVersions *)this,loc,8,300,(char *)0x0,"switch statements");
  TParseVersions::profileRequires
            ((TParseVersions *)this,(TSourceLoc *)expression_local,1,0x82,(char *)0x0,
             "switch statements");
  pTVar7 = (TIntermTyped *)switchSequence;
  wrapupSwitchSubsequence(this,(TIntermAggregate *)switchSequence,(TIntermNode *)0x0);
  if ((lastStatements_local != (TIntermAggregate *)0x0) &&
     ((iVar3 = (*(lastStatements_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                 _vptr_TIntermNode[0x20])(), iVar3 == 8 ||
      (iVar3 = (*(lastStatements_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                 _vptr_TIntermNode[0x20])(), iVar3 == 9)))) {
    iVar3 = (*(lastStatements_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
              _vptr_TIntermNode[0x1e])();
    uVar4 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0xe8))();
    if ((uVar4 & 1) == 0) {
      iVar3 = (*(lastStatements_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                _vptr_TIntermNode[0x1e])();
      uVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar3) + 0xe0))();
      if ((uVar4 & 1) == 0) {
        iVar3 = (*(lastStatements_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode
                  ._vptr_TIntermNode[0x1e])();
        uVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar3) + 0xd8))();
        if ((uVar4 & 1) == 0) goto LAB_006abd70;
      }
    }
  }
  pTVar7 = expression_local;
  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
            (this,expression_local,"condition must be a scalar integer expression","switch","");
LAB_006abd70:
  ppTVar5 = std::__cxx11::
            list<glslang::TVector<TIntermNode_*>_*,_glslang::pool_allocator<glslang::TVector<TIntermNode_*>_*>_>
            ::back(&(this->super_TParseContextBase).switchSequenceStack.
                    super_list<glslang::TVector<TIntermNode_*>_*,_glslang::pool_allocator<glslang::TVector<TIntermNode_*>_*>_>
                  );
  local_38 = (TString *)*ppTVar5;
  sVar6 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::size
                    ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)local_38);
  if (sVar6 == 0) {
    this_local = (TParseContext *)lastStatements_local;
  }
  else {
    if (switchSequence == (TIntermSequence *)0x0) {
      bVar2 = TParseVersions::isEsProfile((TParseVersions *)this);
      if ((!bVar2) ||
         (((300 < (this->super_TParseContextBase).super_TParseVersions.version &&
           ((this->super_TParseContextBase).super_TParseVersions.version < 0x140)) ||
          (bVar2 = TParseVersions::relaxedErrors((TParseVersions *)this), bVar2)))) {
        bVar2 = TParseVersions::isEsProfile((TParseVersions *)this);
        if ((bVar2) ||
           ((0x1ae < (this->super_TParseContextBase).super_TParseVersions.version &&
            ((this->super_TParseContextBase).super_TParseVersions.version < 0x1cc)))) {
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
                    (this,expression_local,"last case/default label not followed by statements",
                     "switch","");
        }
        else {
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,expression_local,"last case/default label not followed by statements",
                     "switch","");
        }
      }
      else {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,expression_local,"last case/default label not followed by statements",
                   "switch","");
      }
      this_00 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      node = TIntermediate::addBranch
                       ((this->super_TParseContextBase).super_TParseVersions.intermediate,EOpBreak,
                        (TSourceLoc *)expression_local);
      switchSequence =
           (TIntermSequence *)TIntermediate::makeAggregate(this_00,&node->super_TIntermNode);
      (*(((TIntermAggregate *)switchSequence)->super_TIntermOperator).super_TIntermTyped.
        super_TIntermNode._vptr_TIntermNode[0x31])(switchSequence,1);
      body = (TIntermAggregate *)switchSequence;
      pTVar7 = (TIntermTyped *)&body;
      std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::push_back
                ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)local_38,
                 (value_type *)pTVar7);
    }
    this_01 = (TIntermAggregate *)TIntermNode::operator_new((TIntermNode *)0x188,(size_t)pTVar7);
    TIntermAggregate::TIntermAggregate(this_01,EOpSequence);
    ppTVar5 = std::__cxx11::
              list<glslang::TVector<TIntermNode_*>_*,_glslang::pool_allocator<glslang::TVector<TIntermNode_*>_*>_>
              ::back(&(this->super_TParseContextBase).switchSequenceStack.
                      super_list<glslang::TVector<TIntermNode_*>_*,_glslang::pool_allocator<glslang::TVector<TIntermNode_*>_*>_>
                    );
    pTVar1 = *ppTVar5;
    iVar3 = (*(this_01->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
              _vptr_TIntermNode[0x32])();
    TVector<TIntermNode_*>::operator=
              ((TVector<TIntermNode_*> *)CONCAT44(extraout_var_02,iVar3),pTVar1);
    pTVar7 = expression_local;
    (*(this_01->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[1])();
    this_02 = (TParseContext *)TIntermNode::operator_new((TIntermNode *)0x38,(size_t)pTVar7);
    TIntermSwitch::TIntermSwitch
              ((TIntermSwitch *)this_02,(TIntermTyped *)lastStatements_local,this_01);
    (*(this_02->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[1])
              (this_02,expression_local);
    this_local = this_02;
  }
  return (TIntermNode *)this_local;
}

Assistant:

TIntermNode* TParseContext::addSwitch(const TSourceLoc& loc, TIntermTyped* expression, TIntermAggregate* lastStatements)
{
    profileRequires(loc, EEsProfile, 300, nullptr, "switch statements");
    profileRequires(loc, ENoProfile, 130, nullptr, "switch statements");

    wrapupSwitchSubsequence(lastStatements, nullptr);

    if (expression == nullptr ||
        (expression->getBasicType() != EbtInt && expression->getBasicType() != EbtUint) ||
        expression->getType().isArray() || expression->getType().isMatrix() || expression->getType().isVector())
            error(loc, "condition must be a scalar integer expression", "switch", "");

    // If there is nothing to do, drop the switch but still execute the expression
    TIntermSequence* switchSequence = switchSequenceStack.back();
    if (switchSequence->size() == 0)
        return expression;

    if (lastStatements == nullptr) {
        // This was originally an ERRROR, because early versions of the specification said
        // "it is an error to have no statement between a label and the end of the switch statement."
        // The specifications were updated to remove this (being ill-defined what a "statement" was),
        // so, this became a warning.  However, 3.0 tests still check for the error.
        if (isEsProfile() && (version <= 300 || version >= 320) && ! relaxedErrors())
            error(loc, "last case/default label not followed by statements", "switch", "");
        else if (!isEsProfile() && (version <= 430 || version >= 460))
            error(loc, "last case/default label not followed by statements", "switch", "");
        else
            warn(loc, "last case/default label not followed by statements", "switch", "");


        // emulate a break for error recovery
        lastStatements = intermediate.makeAggregate(intermediate.addBranch(EOpBreak, loc));
        lastStatements->setOperator(EOpSequence);
        switchSequence->push_back(lastStatements);
    }

    TIntermAggregate* body = new TIntermAggregate(EOpSequence);
    body->getSequence() = *switchSequenceStack.back();
    body->setLoc(loc);

    TIntermSwitch* switchNode = new TIntermSwitch(expression, body);
    switchNode->setLoc(loc);

    return switchNode;
}